

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_storage_t __thiscall Imf_3_4::Context::storage(Context *this,int partidx)

{
  int iVar1;
  element_type *pp_Var2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_storage_t storage;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe20;
  stringstream local_198 [16];
  ostream local_188 [328];
  Context *in_stack_ffffffffffffffc0;
  exr_storage_t local_10;
  int local_c;
  
  local_10 = EXR_STORAGE_LAST_TYPE;
  local_c = in_ESI;
  pp_Var2 = std::
            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_fffffffffffffe20);
  iVar1 = exr_get_storage(*pp_Var2,local_c,&local_10);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar3 = std::operator<<(local_188,"Unable to get storage type for part ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3," in file \'");
    pcVar4 = fileName(in_stack_ffffffffffffffc0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\'");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_198);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return local_10;
}

Assistant:

exr_storage_t
Context::storage (int partidx) const
{
    exr_storage_t storage = EXR_STORAGE_LAST_TYPE;

    if (EXR_ERR_SUCCESS != exr_get_storage (*_ctxt, partidx, &storage))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get storage type for part " << partidx << " in file '"
                                                   << fileName () << "'");
    }

    return storage;
}